

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O1

void __thiscall
spvtools::anon_unknown_0::Disassembler::Disassembler
          (Disassembler *this,AssemblyGrammar *grammar,uint32_t options,NameMapper *name_mapper)

{
  _Manager_type p_Var1;
  stringstream *psVar2;
  ostream *stream;
  bool bVar3;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  
  this->print_ = (bool)((byte)options >> 1 & 1);
  this->nested_indent_ = (bool)((byte)(options >> 8) & 1);
  this->reorder_blocks_ = (bool)((byte)(options >> 9) & 1);
  std::__cxx11::stringstream::stringstream((stringstream *)&this->text_);
  bVar3 = this->print_ == false;
  psVar2 = (stringstream *)0x0;
  if (bVar3) {
    psVar2 = &this->text_;
  }
  (this->out_).pStream = psVar2;
  if (bVar3) {
    stream = (ostream *)(psVar2 + 0x10);
  }
  else {
    stream = (ostream *)&std::cout;
  }
  local_48 = (_Manager_type)0x0;
  p_Stack_40 = (_Invoker_type)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  p_Var1 = (name_mapper->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_58,(_Any_data *)name_mapper,__clone_functor);
    p_Stack_40 = name_mapper->_M_invoker;
    local_48 = (name_mapper->super__Function_base)._M_manager;
  }
  disassemble::InstructionDisassembler::InstructionDisassembler
            (&this->instruction_disassembler_,grammar,stream,options,(NameMapper *)&local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  this->header_ = (options & 0x20) == 0;
  (this->current_function_cfg_).blocks.
  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->current_function_cfg_).blocks.
  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->current_function_cfg_).blocks.
  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->byte_offset_ = 0;
  *(undefined4 *)((long)&this->byte_offset_ + 7) = 0;
  return;
}

Assistant:

Disassembler(const AssemblyGrammar& grammar, uint32_t options,
               NameMapper name_mapper)
      : print_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_PRINT, options)),
        nested_indent_(
            spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_NESTED_INDENT, options)),
        reorder_blocks_(
            spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_REORDER_BLOCKS, options)),
        text_(),
        out_(print_ ? out_stream() : out_stream(text_)),
        instruction_disassembler_(grammar, out_.get(), options, name_mapper),
        header_(!spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_NO_HEADER, options)),
        byte_offset_(0) {}